

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::print_hand(Board *this,Hand *hand)

{
  ostream *poVar1;
  pointer this_00;
  string local_50;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Printing hand....");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (this_00 = (hand->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      this_00 !=
      (hand->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
      _M_finish; this_00 = this_00 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Card is ");
    Card::Card2Str_abi_cxx11_(&local_50,this_00);
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_50);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"....");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Board::print_hand(Hand hand)
{
  std::cout << "Printing hand...." << std::endl;
  for(std::vector<Card>::iterator it = hand.begin(); it != hand.end(); ++it) {
    std::cout << "Card is " << it->Card2Str() << std::endl;
  }
  std::cout << "...." << std::endl;
}